

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

Options * __thiscall
ApprovalTests::Options::FileOptions::withFileExtension
          (FileOptions *this,string *fileExtensionWithDot)

{
  int in_ECX;
  string *in_RDX;
  undefined8 *in_RSI;
  Options *in_RDI;
  void *in_R8;
  FileOptions newSelf;
  string *in_stack_ffffffffffffff68;
  Options *this_00;
  string local_60 [32];
  undefined1 local_40 [64];
  
  this_00 = in_RDI;
  ::std::__cxx11::string::string(local_60,in_RDX);
  FileOptions(&this_00->fileOptions_,in_stack_ffffffffffffff68);
  ::std::__cxx11::string::~string(local_60);
  Options::clone(this_00,(__fn *)*in_RSI,local_40,in_ECX,in_R8);
  ~FileOptions((FileOptions *)0x2006ce);
  return in_RDI;
}

Assistant:

Options
    Options::FileOptions::withFileExtension(const std::string& fileExtensionWithDot) const
    {
        FileOptions newSelf(fileExtensionWithDot);
        return options_->clone(newSelf);
    }